

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<2,_151>::
LJValueType<njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_void>::
JValue::generateList
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,double spin,double d,
          int amun,double gn,double gg,vector<double,_std::allocator<double>_> *gf)

{
  initializer_list<double> __l;
  allocator_type local_41;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  undefined8 local_18;
  
  local_30 = (double)amun;
  local_18 = 0;
  __l._M_len = 6;
  __l._M_array = &local_40;
  local_40 = d;
  local_38 = spin;
  local_28 = gn;
  local_20 = gg;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_41);
  std::vector<double,std::allocator<double>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((vector<double,std::allocator<double>> *)__return_storage_ptr__,
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (gf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (gf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

static std::vector< double >
generateList( double spin,
              double d,
              int amun,
              double gn,
              double gg,
              std::vector< double >&& gf ) {

  std::vector< double > list{ d, spin, static_cast<double>( amun ),
                              gn, gg, 0.0 };
  list.insert( list.end(), gf.begin(), gf.end() );
  return list;
}